

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlankingSector.cpp
# Opt level: O3

void __thiscall DIS::BlankingSector::unmarshal(BlankingSector *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_recordType);
  DataStream::operator>>(dataStream,&this->_recordLength);
  DataStream::operator>>(dataStream,&this->_emitterNumber);
  DataStream::operator>>(dataStream,&this->_beamNumber);
  DataStream::operator>>(dataStream,&this->_stateIndicator);
  DataStream::operator>>(dataStream,&this->_leftAzimuth);
  DataStream::operator>>(dataStream,&this->_rightAzimuth);
  DataStream::operator>>(dataStream,&this->_lowerElevation);
  DataStream::operator>>(dataStream,&this->_upperElevation);
  DataStream::operator>>(dataStream,&this->_residualPower);
  return;
}

Assistant:

void BlankingSector::unmarshal(DataStream& dataStream)
{
    dataStream >> _recordType;
    dataStream >> _recordLength;
    dataStream >> _emitterNumber;
    dataStream >> _beamNumber;
    dataStream >> _stateIndicator;
    dataStream >> _leftAzimuth;
    dataStream >> _rightAzimuth;
    dataStream >> _lowerElevation;
    dataStream >> _upperElevation;
    dataStream >> _residualPower;
}